

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  uint __val;
  bool bVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  uint uVar5;
  Index IVar6;
  ulong uVar7;
  string __str;
  string buffer;
  long *local_78;
  uint local_70;
  long local_68 [2];
  BinaryReaderObjdumpDisassemble *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (this->in_function_body == true) {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    local_58 = this;
    if (num_targets != 0) {
      uVar7 = 0;
      do {
        __val = target_depths[uVar7];
        cVar3 = '\x01';
        if (9 < __val) {
          uVar5 = __val;
          cVar2 = '\x04';
          do {
            cVar3 = cVar2;
            if (uVar5 < 100) {
              cVar3 = cVar3 + -2;
              goto LAB_001132d3;
            }
            if (uVar5 < 1000) {
              cVar3 = cVar3 + -1;
              goto LAB_001132d3;
            }
            if (uVar5 < 10000) goto LAB_001132d3;
            bVar1 = 99999 < uVar5;
            uVar5 = uVar5 / 10000;
            cVar2 = cVar3 + '\x04';
          } while (bVar1);
          cVar3 = cVar3 + '\x01';
        }
LAB_001132d3:
        local_78 = local_68;
        std::__cxx11::string::_M_construct((ulong)&local_78,cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,local_70,__val);
        pcVar4 = (char *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78);
        std::__cxx11::string::append(pcVar4);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != num_targets);
    }
    cVar3 = '\x01';
    if (9 < default_target_depth) {
      IVar6 = default_target_depth;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (IVar6 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0011338e;
        }
        if (IVar6 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0011338e;
        }
        if (IVar6 < 10000) goto LAB_0011338e;
        bVar1 = 99999 < IVar6;
        IVar6 = IVar6 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_0011338e:
    local_78 = local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,local_70,default_target_depth);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
    LogOpcode(local_58,"%s",local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  if (!in_function_body) {
    return Result::Ok;
  }

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode("%s", buffer.c_str());
  return Result::Ok;
}